

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManResubTest3(void)

{
  int *piVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  word Truth;
  int *pArray;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xcccccccccccccccc;
  local_48 = 0xf0f0f0f0f0f0f0f0;
  local_40 = 0xff00ff00ff00ff00;
  p = Vec_PtrAlloc(6);
  p_00 = Vec_IntAlloc(100);
  for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 8) {
    Vec_PtrPush(p,(void *)((long)&local_68 + lVar4));
  }
  Abc_ResubPrepareManager(1);
  uVar3 = 0;
  do {
    Truth = uVar3 * 0x1000100010001;
    local_68 = ~Truth;
    uStack_60 = Truth;
    printf("%3d : ",uVar3 & 0xffffffff);
    Extra_PrintHex(_stdout,(uint *)&Truth,4);
    putchar(0x20);
    Dau_DsdPrintFromTruth2(&Truth,4);
    printf("           ");
    uVar2 = Abc_ResubComputeFunction(p->pArray,p->nSize,1,0x10,0x32,0,0,1,1,&pArray);
    putchar(10);
    piVar1 = pArray;
    p_00->nSize = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      Vec_IntPush(p_00,piVar1[uVar5]);
    }
    bVar6 = uVar3 != 1000;
    uVar3 = uVar3 + 1;
  } while (bVar6);
  Abc_ResubPrepareManager(0);
  Vec_IntFree(p_00);
  Vec_PtrFree(p);
  return;
}

Assistant:

void Gia_ManResubTest3()
{
    int nVars = 4;
    int fVerbose = 1;
    word Divs[6] = { 0, 0, 
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00) 
    };
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( 6 );
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i, k, ArraySize, * pArray; 
    for ( i = 0; i < 6; i++ )
        Vec_PtrPush( vDivs, Divs+i );
    Abc_ResubPrepareManager( 1 );
    for ( i = 0; i < (1<<(1<<nVars)); i++ ) //if ( i == 0xCA ) 
    {
        word Truth = Abc_Tt6Stretch( i, nVars );
        Divs[0] = ~Truth;
        Divs[1] =  Truth;
        printf( "%3d : ", i );
        Extra_PrintHex( stdout, (unsigned*)&Truth, nVars );
        printf( " " );
        Dau_DsdPrintFromTruth2( &Truth, nVars );
        printf( "           " );

        //Abc_ResubDumpProblem( "temp.resub", (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1 );
        ArraySize = Abc_ResubComputeFunction( (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1, 16, 50, 0, 0, 1, fVerbose, &pArray );
        printf( "\n" );

        Vec_IntClear( vRes );
        for ( k = 0; k < ArraySize; k++ )
            Vec_IntPush( vRes, pArray[k] );

        if ( i == 1000 )
            break;
    }
    Abc_ResubPrepareManager( 0 );
    Vec_IntFree( vRes );
    Vec_PtrFree( vDivs );
}